

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_net_pton.c
# Opt level: O0

int ares_inet_net_pton_ipv4(char *src,uchar *dst,size_t size)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  byte *pbVar5;
  size_t sVar6;
  size_t sVar7;
  bool local_4f;
  bool local_4d;
  bool local_4b;
  uchar *odst;
  int local_38;
  int bits;
  int dirty;
  int tmp;
  int ch;
  int n;
  size_t size_local;
  uchar *dst_local;
  char *src_local;
  
  bits = 0;
  memset(dst,0,size);
  dst_local = (uchar *)(src + 1);
  bVar1 = *src;
  dirty = (int)(char)bVar1;
  if (((dirty == 0x30) && (((*dst_local == 'x' || (*dst_local == 'X')) && ((byte)src[2] < 0x80))))
     && ((((0x2f < (byte)src[2] && ((byte)src[2] < 0x3a)) ||
          ((0x60 < (byte)src[2] && ((byte)src[2] < 0x67)))) ||
         ((0x40 < (byte)src[2] && ((byte)src[2] < 0x47)))))) {
    if (size != 0) {
      local_38 = 0;
      _ch = size;
      size_local = (size_t)dst;
      dst_local = (uchar *)(src + 2);
      while( true ) {
        pbVar5 = dst_local + 1;
        bVar1 = *dst_local;
        dirty = (int)(char)bVar1;
        local_4b = false;
        if ((((dirty != 0) && (local_4b = false, bVar1 < 0x80)) &&
            ((bVar1 < 0x30 || (local_4b = true, 0x39 < bVar1)))) &&
           ((bVar1 < 0x61 || (local_4b = true, 0x66 < bVar1)))) {
          local_4b = 0x40 < bVar1 && bVar1 < 0x47;
        }
        if (!local_4b) break;
        if ((0x40 < bVar1) && (bVar1 < 0x5b)) {
          bVar1 = ares_tolower(bVar1);
          dirty = (int)bVar1;
        }
        pcVar3 = strchr("0123456789abcdef",dirty);
        uVar2 = (int)pcVar3 - 0x13ea70;
        if (local_38 != 0) {
          uVar2 = bits << 4 | uVar2;
        }
        bits = uVar2;
        local_38 = local_38 + 1;
        dst_local = pbVar5;
        if (local_38 == 2) {
          if (_ch == 0) goto LAB_0012204b;
          *(char *)size_local = (char)bits;
          local_38 = 0;
          _ch = _ch - 1;
          size_local = size_local + 1;
        }
      }
      if (local_38 == 0) goto LAB_00121e07;
      if (_ch != 0) {
        *(char *)size_local = (char)(bits << 4);
        _ch = _ch - 1;
        size_local = size_local + 1;
LAB_00121e07:
        dst_local = pbVar5;
        odst._4_4_ = -1;
        if ((((dirty == 0x2f) && (*dst_local < 0x80)) && (0x2f < *dst_local)) &&
           ((*dst_local < 0x3a && (dst < size_local)))) {
          dirty = (int)(char)*dst_local;
          odst._4_4_ = 0;
          do {
            dst_local = dst_local + 1;
            pcVar3 = strchr("0123456789",dirty);
            odst._4_4_ = (int)pcVar3 + -0x13ea81 + odst._4_4_ * 10;
            if (0x20 < odst._4_4_) goto LAB_00122037;
            bVar1 = *dst_local;
            dirty = (int)(char)bVar1;
            local_4f = false;
            if ((dirty != 0) && (local_4f = false, bVar1 < 0x80)) {
              local_4f = 0x2f < bVar1 && bVar1 < 0x3a;
            }
          } while (local_4f);
          if (dirty != 0) goto LAB_00122037;
          dirty = 0;
        }
        if ((dirty != 0) || ((uchar *)size_local == dst)) goto LAB_00122037;
        if (odst._4_4_ == -1) {
          if (*dst < 0xf0) {
            if (*dst < 0xe0) {
              if (*dst < 0xc0) {
                if (*dst < 0x80) {
                  odst._4_4_ = 8;
                }
                else {
                  odst._4_4_ = 0x10;
                }
              }
              else {
                odst._4_4_ = 0x18;
              }
            }
            else {
              odst._4_4_ = 8;
            }
          }
          else {
            odst._4_4_ = 0x20;
          }
          if ((long)odst._4_4_ < (long)((size_local - (long)dst) * 8)) {
            odst._4_4_ = ((int)size_local - (int)dst) * 8;
          }
          if ((odst._4_4_ == 8) && (*dst == 0xe0)) {
            odst._4_4_ = 4;
          }
        }
        while( true ) {
          if ((long)odst._4_4_ <= (long)((size_local - (long)dst) * 8)) {
            return odst._4_4_;
          }
          if (_ch == 0) break;
          *(undefined1 *)size_local = 0;
          _ch = _ch - 1;
          size_local = size_local + 1;
        }
      }
    }
LAB_0012204b:
    piVar4 = __errno_location();
    *piVar4 = 0x5a;
  }
  else {
    if ((bVar1 < 0x80) && ((0x2f < bVar1 && (_ch = size, size_local = (size_t)dst, bVar1 < 0x3a))))
    {
      while( true ) {
        bits = 0;
        pbVar5 = dst_local;
        do {
          dst_local = pbVar5;
          pcVar3 = strchr("0123456789",dirty);
          bits = (int)pcVar3 + -0x13ea81 + bits * 10;
          if (0xff < bits) goto LAB_00122037;
          pbVar5 = dst_local + 1;
          bVar1 = *dst_local;
          dirty = (int)(char)bVar1;
          local_4d = false;
          if ((dirty != 0) && (local_4d = false, bVar1 < 0x80)) {
            local_4d = 0x2f < bVar1 && bVar1 < 0x3a;
          }
        } while (local_4d);
        sVar6 = _ch - 1;
        if (_ch == 0) goto LAB_0012204b;
        sVar7 = size_local + 1;
        *(char *)size_local = (char)bits;
        _ch = sVar6;
        size_local = sVar7;
        if ((dirty == 0) || (dirty == 0x2f)) goto LAB_00121e07;
        if (dirty != 0x2e) break;
        dst_local = dst_local + 2;
        bVar1 = *pbVar5;
        dirty = (int)(char)bVar1;
        if (((0x7f < bVar1) || (bVar1 < 0x30)) || (0x39 < bVar1)) break;
      }
    }
LAB_00122037:
    piVar4 = __errno_location();
    *piVar4 = 2;
  }
  return -1;
}

Assistant:

static int ares_inet_net_pton_ipv4(const char *src, unsigned char *dst,
                                   size_t size)
{
  static const char    xdigits[] = "0123456789abcdef";
  static const char    digits[]  = "0123456789";
  int                  n;
  int                  ch;
  int                  tmp = 0;
  int                  dirty;
  int                  bits;
  const unsigned char *odst = dst;

  memset(dst, 0, size);
  ch = *src++;
  if (ch == '0' && (src[0] == 'x' || src[0] == 'X') && ares_isascii(src[1]) &&
      ares_isxdigit(src[1])) {
    /* Hexadecimal: Eat nybble string. */
    if (!size) {
      goto emsgsize;
    }
    dirty = 0;
    src++; /* skip x or X. */
    while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isxdigit(ch)) {
      if (ares_isupper(ch)) {
        ch = ares_tolower((unsigned char)ch);
      }
      n = (int)(strchr(xdigits, ch) - xdigits);
      if (dirty == 0) {
        tmp = n;
      } else {
        tmp = (tmp << 4) | n;
      }
      if (++dirty == 2) {
        if (!size--) {
          goto emsgsize;
        }
        *dst++ = (unsigned char)tmp;
        dirty  = 0;
      }
    }
    if (dirty) { /* Odd trailing nybble? */
      if (!size--) {
        goto emsgsize;
      }
      *dst++ = (unsigned char)(tmp << 4);
    }
  } else if (ares_isascii(ch) && ares_isdigit(ch)) {
    /* Decimal: eat dotted digit string. */
    for (;;) {
      tmp = 0;
      do {
        n    = (int)(strchr(digits, ch) - digits);
        tmp *= 10;
        tmp += n;
        if (tmp > 255) {
          goto enoent;
        }
      } while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isdigit(ch));
      if (!size--) {
        goto emsgsize;
      }
      *dst++ = (unsigned char)tmp;
      if (ch == '\0' || ch == '/') {
        break;
      }
      if (ch != '.') {
        goto enoent;
      }
      ch = *src++;
      if (!ares_isascii(ch) || !ares_isdigit(ch)) {
        goto enoent;
      }
    }
  } else {
    goto enoent;
  }

  bits = -1;
  if (ch == '/' && ares_isascii(src[0]) && ares_isdigit(src[0]) && dst > odst) {
    /* CIDR width specifier.  Nothing can follow it. */
    ch   = *src++; /* Skip over the /. */
    bits = 0;
    do {
      n     = (int)(strchr(digits, ch) - digits);
      bits *= 10;
      bits += n;
      if (bits > 32) {
        goto enoent;
      }
    } while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isdigit(ch));
    if (ch != '\0') {
      goto enoent;
    }
  }

  /* Firey death and destruction unless we prefetched EOS. */
  if (ch != '\0') {
    goto enoent;
  }

  /* If nothing was written to the destination, we found no address. */
  if (dst == odst) {
    goto enoent; /* LCOV_EXCL_LINE: all valid paths above increment dst */
  }
  /* If no CIDR spec was given, infer width from net class. */
  if (bits == -1) {
    if (*odst >= 240) {        /* Class E */
      bits = 32;
    } else if (*odst >= 224) { /* Class D */
      bits = 8;
    } else if (*odst >= 192) { /* Class C */
      bits = 24;
    } else if (*odst >= 128) { /* Class B */
      bits = 16;
    } else {                   /* Class A */
      bits = 8;
    }
    /* If imputed mask is narrower than specified octets, widen. */
    if (bits < ((dst - odst) * 8)) {
      bits = (int)(dst - odst) * 8;
    }
    /*
     * If there are no additional bits specified for a class D
     * address adjust bits to 4.
     */
    if (bits == 8 && *odst == 224) {
      bits = 4;
    }
  }
  /* Extend network to cover the actual mask. */
  while (bits > ((dst - odst) * 8)) {
    if (!size--) {
      goto emsgsize;
    }
    *dst++ = '\0';
  }
  return bits;

enoent:
  SET_SOCKERRNO(ENOENT);
  return -1;

emsgsize:
  SET_SOCKERRNO(EMSGSIZE);
  return -1;
}